

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

void us_internal_dispatch_ready_poll(us_poll_t *p,int error,int events)

{
  _func_us_socket_t_ptr_us_socket_t_ptr_int_char_ptr_int *p_Var1;
  uint uVar2;
  int iVar3;
  us_socket_t *s_00;
  char *pcVar4;
  us_socket_context_t *puVar5;
  uint in_EDX;
  int in_ESI;
  us_socket_context_t *in_RDI;
  int length;
  us_socket_t *s_2;
  us_socket_t *s_1;
  us_poll_t *accepted_p;
  int client_fd;
  bsd_addr_t addr;
  us_listen_socket_t *listen_socket;
  us_socket_t *s;
  us_internal_callback_t *cb;
  uint in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  us_loop_t *in_stack_fffffffffffffed0;
  us_socket_context_t *puVar6;
  us_loop_t *in_stack_fffffffffffffed8;
  us_loop_t *loop;
  us_socket_context_t *in_stack_fffffffffffffee0;
  us_socket_context_t *local_f8;
  us_socket_context_t *local_e0;
  bsd_addr_t local_c0;
  us_socket_context_t *local_28;
  us_socket_context_t *local_20;
  us_socket_context_t *local_18;
  uint local_10;
  int local_c;
  us_socket_context_t *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  uVar2 = us_internal_poll_type((us_poll_t *)in_RDI);
  if (uVar2 < 2) {
    local_e0 = local_8;
    if (local_c == 0) {
      if ((local_10 & 4) != 0) {
        *(undefined4 *)(*(long *)&local_8->iterator->p + 0x10) = 0;
        local_e0 = (us_socket_context_t *)(**(code **)&local_8->iterator[1].p.field_0x8)();
        iVar3 = us_socket_is_closed(0,(us_socket_t *)local_e0);
        if (iVar3 != 0) {
          return;
        }
        if ((*(int *)(*(long *)&local_e0->iterator->p + 0x10) == 0) ||
           (iVar3 = us_socket_is_shut_down
                              ((int)in_stack_fffffffffffffed0,
                               (us_socket_t *)
                               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
           iVar3 != 0)) {
          in_stack_fffffffffffffee0 = local_e0;
          us_socket_context(0,(us_socket_t *)local_e0);
          us_poll_events((us_poll_t *)local_e0);
          us_poll_change((us_poll_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        }
      }
      if (((local_10 & 1) != 0) &&
         (iVar3 = (**(code **)&local_e0->iterator[1].timeout)((us_socket_t *)local_e0), iVar3 == 0))
      {
        us_poll_fd((us_poll_t *)local_e0);
        iVar3 = bsd_recv((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0,
                         0x1060ba);
        if (iVar3 < 1) {
          if (iVar3 == 0) {
            iVar3 = us_socket_is_shut_down
                              ((int)in_stack_fffffffffffffed0,
                               (us_socket_t *)
                               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            if (iVar3 == 0) {
              puVar6 = local_e0;
              puVar5 = us_socket_context(0,(us_socket_t *)local_e0);
              iVar3 = (int)((ulong)puVar6 >> 0x20);
              loop = puVar5->loop;
              us_poll_events((us_poll_t *)local_e0);
              us_poll_change((us_poll_t *)in_stack_fffffffffffffee0,loop,iVar3);
              (*(code *)local_e0->iterator[1].next)((us_socket_t *)local_e0);
            }
            else {
              us_socket_close(in_stack_fffffffffffffecc,(us_socket_t *)0x10611f);
            }
          }
          else if ((iVar3 == -1) && (iVar3 = bsd_would_block(), iVar3 == 0)) {
            us_socket_close(in_stack_fffffffffffffecc,(us_socket_t *)0x10619a);
          }
        }
        else {
          (**(code **)&local_e0->iterator[1].p)
                    ((us_socket_t *)local_e0,
                     (char *)(*(long *)(*(long *)&local_e0->iterator->p + 0x28) + 0x20),iVar3);
        }
      }
    }
    else {
      us_socket_close(in_stack_fffffffffffffecc,(us_socket_t *)0x105f9d);
    }
  }
  else if (uVar2 == 2) {
    iVar3 = us_poll_events((us_poll_t *)local_8);
    if (iVar3 == 4) {
      local_20 = local_8;
      us_poll_change((us_poll_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      us_poll_fd((us_poll_t *)local_8);
      bsd_socket_nodelay(0,0x105dd2);
      us_internal_poll_set_type((us_poll_t *)local_8,0);
      (*((us_socket_context_t *)local_20->iterator)->on_open)
                ((us_socket_t *)local_20,1,(char *)0x0,0);
    }
    else {
      local_28 = local_8;
      us_poll_fd((us_poll_t *)local_8);
      iVar3 = bsd_accept_socket((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                (bsd_addr_t *)in_stack_fffffffffffffed8);
      while (iVar3 != -1) {
        us_socket_context(0,(us_socket_t *)local_28);
        s_00 = (us_socket_t *)
               us_create_poll(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                              in_stack_fffffffffffffec8);
        us_poll_init((us_poll_t *)s_00,iVar3,0);
        us_poll_start((us_poll_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                      (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        s_00->context = (us_socket_context_t *)local_28->iterator;
        bsd_socket_nodelay(0,0x105ed0);
        us_internal_socket_context_link((us_socket_context_t *)local_28->iterator,s_00);
        p_Var1 = ((us_socket_context_t *)local_28->iterator)->on_open;
        pcVar4 = bsd_addr_get_ip(&local_c0);
        iVar3 = bsd_addr_get_ip_length(&local_c0);
        (*p_Var1)(s_00,0,pcVar4,iVar3);
        iVar3 = us_socket_is_closed(0,(us_socket_t *)local_28);
        if (iVar3 != 0) {
          return;
        }
        us_poll_fd((us_poll_t *)local_8);
        iVar3 = bsd_accept_socket((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                  (bsd_addr_t *)in_stack_fffffffffffffed8);
      }
    }
  }
  else if (uVar2 == 3) {
    us_internal_accept_poll_event((us_poll_t *)in_stack_fffffffffffffee0);
    local_18 = local_8;
    if (*(int *)&local_8->prev == 0) {
      local_f8 = local_8;
    }
    else {
      local_f8 = (us_socket_context_t *)local_8->iterator;
    }
    (*(code *)local_8->next)(local_f8);
  }
  return;
}

Assistant:

void us_internal_dispatch_ready_poll(struct us_poll_t *p, int error, int events) {
    switch (us_internal_poll_type(p)) {
    case POLL_TYPE_CALLBACK: {
            us_internal_accept_poll_event(p);
            struct us_internal_callback_t *cb = (struct us_internal_callback_t *) p;
            cb->cb(cb->cb_expects_the_loop ? (struct us_internal_callback_t *) cb->loop : (struct us_internal_callback_t *) &cb->p);
        }
        break;
    case POLL_TYPE_SEMI_SOCKET: {
            /* Both connect and listen sockets are semi-sockets
             * but they poll for different events */
            if (us_poll_events(p) == LIBUS_SOCKET_WRITABLE) {
                struct us_socket_t *s = (struct us_socket_t *) p;

                us_poll_change(p, s->context->loop, LIBUS_SOCKET_READABLE);

                /* We always use nodelay */
                bsd_socket_nodelay(us_poll_fd(p), 1);

                /* We are now a proper socket */
                us_internal_poll_set_type(p, POLL_TYPE_SOCKET);

                s->context->on_open(s, 1, 0, 0);
            } else {
                struct us_listen_socket_t *listen_socket = (struct us_listen_socket_t *) p;
                struct bsd_addr_t addr;

                LIBUS_SOCKET_DESCRIPTOR client_fd = bsd_accept_socket(us_poll_fd(p), &addr);
                if (client_fd == LIBUS_SOCKET_ERROR) {
                    /* Todo: start timer here */

                } else {

                    /* Todo: stop timer if any */

                    do {
                        struct us_poll_t *accepted_p = us_create_poll(us_socket_context(0, &listen_socket->s)->loop, 0, sizeof(struct us_socket_t) - sizeof(struct us_poll_t) + listen_socket->socket_ext_size);
                        us_poll_init(accepted_p, client_fd, POLL_TYPE_SOCKET);
                        us_poll_start(accepted_p, listen_socket->s.context->loop, LIBUS_SOCKET_READABLE);

                        struct us_socket_t *s = (struct us_socket_t *) accepted_p;

                        s->context = listen_socket->s.context;

                        /* We always use nodelay */
                        bsd_socket_nodelay(client_fd, 1);

                        us_internal_socket_context_link(listen_socket->s.context, s);

                        listen_socket->s.context->on_open(s, 0, bsd_addr_get_ip(&addr), bsd_addr_get_ip_length(&addr));

                        /* Exit accept loop if listen socket was closed in on_open handler */
                        if (us_socket_is_closed(0, &listen_socket->s)) {
                            break;
                        }

                    } while ((client_fd = bsd_accept_socket(us_poll_fd(p), &addr)) != LIBUS_SOCKET_ERROR);
                }
            }
        }
        break;
    case POLL_TYPE_SOCKET_SHUT_DOWN:
    case POLL_TYPE_SOCKET: {
            /* We should only use s, no p after this point */
            struct us_socket_t *s = (struct us_socket_t *) p;

            /* Such as epollerr epollhup */
            if (error) {
                s = us_socket_close(0, s);
                return;
            }

            if (events & LIBUS_SOCKET_WRITABLE) {
                /* Note: if we failed a write as a socket of one loop then adopted
                 * to another loop, this will be wrong. Absurd case though */
                s->context->loop->data.last_write_failed = 0;

                s = s->context->on_writable(s);

                if (us_socket_is_closed(0, s)) {
                    return;
                }

                /* If we have no failed write or if we shut down, then stop polling for more writable */
                if (!s->context->loop->data.last_write_failed || us_socket_is_shut_down(0, s)) {
                    us_poll_change(&s->p, us_socket_context(0, s)->loop, us_poll_events(&s->p) & LIBUS_SOCKET_READABLE);
                }
            }

            if (events & LIBUS_SOCKET_READABLE) {
                /* Contexts may ignore data and postpone it to next iteration, for balancing purposes such as
                 * when SSL handshakes take too long to finish and we only want a few of them per iteration */
                if (s->context->ignore_data(s)) {
                    break;
                }

                int length = bsd_recv(us_poll_fd(&s->p), s->context->loop->data.recv_buf + LIBUS_RECV_BUFFER_PADDING, LIBUS_RECV_BUFFER_LENGTH, 0);
                if (length > 0) {
                    s = s->context->on_data(s, s->context->loop->data.recv_buf + LIBUS_RECV_BUFFER_PADDING, length);
                } else if (!length) {
                    if (us_socket_is_shut_down(0, s)) {
                        /* We got FIN back after sending it */
                        s = us_socket_close(0, s);
                    } else {
                        /* We got FIN, so stop polling for readable */
                        us_poll_change(&s->p, us_socket_context(0, s)->loop, us_poll_events(&s->p) & LIBUS_SOCKET_WRITABLE);
                        s = s->context->on_end(s);
                    }
                } else if (length == LIBUS_SOCKET_ERROR && !bsd_would_block()) {
                    s = us_socket_close(0, s);
                }
            }
        }
        break;
    }
}